

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_surf.cc
# Opt level: O2

bool __thiscall
hwtest::pgraph::anon_unknown_8::MthdSurfSwzFormat::is_valid_val(MthdSurfSwzFormat *this)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  if (((((uVar1 & 0xffff) != 0) &&
       (uVar2 = (this->super_SingleMthdTest).super_MthdTest.cls,
       (uVar1 & 0xffff) <= 0xe - ((uVar2 & 0xff00) == 0))) && (uVar1 < 0xc000000)) &&
     (0xfffffff4 < (uVar1 >> 0x10 & 0xff) - 0xc)) {
    return uVar2 != 0x52 || 0xffffff < uVar1;
  }
  return false;
}

Assistant:

bool is_valid_val() override {
		int fmt = extr(val, 0, 16);
		if (fmt == 0 || fmt > (cls & 0xff00 ? 0xe : 0xd))
			return false;
		int swzx = extr(val, 16, 8);
		int swzy = extr(val, 24, 8);
		if (swzx > 0xb)
			return false;
		if (swzy > 0xb)
			return false;
		if (swzx == 0)
			return false;
		if (swzy == 0 && cls == 0x52)
			return false;
		return true;
	}